

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.h
# Opt level: O2

RepeatedPtrField<google::protobuf::Message> * __thiscall
google::protobuf::Reflection::
GetRawSplit<google::protobuf::RepeatedPtrField<google::protobuf::Message>>
          (Reflection *this,Message *message,FieldDescriptor *field)

{
  char *pcVar1;
  bool bVar2;
  uint32_t uVar3;
  OneofDescriptor *pOVar4;
  void *pvVar5;
  RepeatedPtrField<google::protobuf::Message> *pRVar6;
  LogMessage *this_00;
  string_view v;
  LogMessage LStack_38;
  
  VerifyFieldType<google::protobuf::RepeatedPtrField<google::protobuf::Message>>(this,field);
  pOVar4 = FieldDescriptor::real_containing_oneof(field);
  if (pOVar4 == (OneofDescriptor *)0x0) {
    pvVar5 = GetSplitField(this,message);
    uVar3 = internal::ReflectionSchema::GetFieldOffsetNonOneof(&this->schema_,field);
    bVar2 = internal::
            SplitFieldHasExtraIndirectionStatic<google::protobuf::RepeatedPtrField<google::protobuf::Message>>
                      (field);
    pRVar6 = (RepeatedPtrField<google::protobuf::Message> *)((ulong)uVar3 + (long)pvVar5);
    if (bVar2) {
      pRVar6 = (RepeatedPtrField<google::protobuf::Message> *)
               (pRVar6->super_RepeatedPtrFieldBase).tagged_rep_or_elem_;
    }
    return pRVar6;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&LStack_38,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/message.h"
             ,0x6eb,"!schema_.InRealOneof(field)");
  this_00 = absl::lts_20250127::log_internal::LogMessage::operator<<
                      (&LStack_38,(char (*) [9])"Field = ");
  pcVar1 = (field->all_names_).payload_;
  v._M_len = (ulong)*(ushort *)(pcVar1 + 2);
  v._M_str = pcVar1 + ~v._M_len;
  absl::lts_20250127::log_internal::LogMessage::operator<<(this_00,v);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&LStack_38)
  ;
}

Assistant:

const Type& Reflection::GetRawSplit(const Message& message,
                                    const FieldDescriptor* field) const {
  VerifyFieldType<Type>(field);
  ABSL_DCHECK(!schema_.InRealOneof(field)) << "Field = " << field->full_name();

  const void* split = GetSplitField(&message);
  const uint32_t field_offset = schema_.GetFieldOffsetNonOneof(field);
  if (internal::SplitFieldHasExtraIndirectionStatic<Type>(field)) {
    return **internal::GetConstPointerAtOffset<Type*>(split, field_offset);
  }
  return *internal::GetConstPointerAtOffset<Type>(split, field_offset);
}